

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

void __thiscall
QDialogButtonBoxPrivate::removeButton
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,RemoveReason reason)

{
  long lVar1;
  long in_FS_OFFSET;
  QWidget *local_38;
  QWidget *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &button->super_QWidget;
  if (button != (QAbstractButton *)0x0) {
    QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
    ::remove(&this->hiddenButtons,(char *)&local_30);
    for (lVar1 = 600; lVar1 != 0x330; lVar1 = lVar1 + 0x18) {
      QtPrivate::sequential_erase_one<QList<QAbstractButton*>,QAbstractButton*>
                ((QList<QAbstractButton_*> *)
                 (&(this->super_QWidgetPrivate).super_QObjectPrivate + lVar1),
                 (QAbstractButton **)&local_30);
    }
    if (reason == ManualRemove) {
      QWidget::setParent(local_30,(QWidget *)0x0);
      QObjectPrivate::disconnect<void(QAbstractButton::*)(bool),void(QDialogButtonBoxPrivate::*)()>
                ((Object *)local_30,(offset_in_QAbstractButton_to_subr)QAbstractButton::clicked,
                 (Object *)0x0,(Function)this);
      QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QDialogButtonBoxPrivate::*)()>
                (&local_30->super_QObject,(offset_in_QObject_to_subr)QObject::destroyed,
                 (Object *)0x0,(Function)this);
      QObject::removeEventFilter(&local_30->super_QObject);
    }
    else if (reason != Destroyed) goto LAB_00435273;
    local_38 = local_30;
    QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
    ::remove(&this->standardButtonMap,(char *)&local_38);
  }
LAB_00435273:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBoxPrivate::removeButton(QAbstractButton *button, RemoveReason reason)
{
    if (!button)
        return;

    // Remove button from hidden buttons and roles
    hiddenButtons.remove(button);
    for (int i = 0; i < QDialogButtonBox::NRoles; ++i)
        buttonLists[i].removeOne(button);

    switch (reason) {
    case RemoveReason::ManualRemove:
        button->setParent(nullptr);
        QObjectPrivate::disconnect(button, &QAbstractButton::clicked,
                                   this, &QDialogButtonBoxPrivate::handleButtonClicked);
        QObjectPrivate::disconnect(button, &QAbstractButton::destroyed,
                                   this, &QDialogButtonBoxPrivate::handleButtonDestroyed);
        button->removeEventFilter(filter.get());
        Q_FALLTHROUGH();
    case RemoveReason::Destroyed:
        standardButtonMap.remove(reinterpret_cast<QPushButton *>(button));
        break;
    case RemoveReason::HideEvent:
        break;
    }
}